

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O0

void __thiscall HighsRandom::advance(HighsRandom *this)

{
  HighsRandom *this_local;
  
  this->state = this->state >> 0xc ^ this->state;
  this->state = this->state << 0x19 ^ this->state;
  this->state = this->state >> 0x1b ^ this->state;
  return;
}

Assistant:

void advance() {
    // advance state with simple xorshift the outputs are produced by applying
    // strongly universal hash functions to the state so that the least
    // significant bits are as well distributed as the most significant bits.
    state ^= state >> 12;
    state ^= state << 25;
    state ^= state >> 27;
  }